

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::ServiceDescriptorProto::ByteSizeLong(ServiceDescriptorProto *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ServiceDescriptorProto *in_RDI;
  int cached_size;
  MethodDescriptorProto *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *__range2;
  uint32 cached_has_bits;
  size_t total_size;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  reference in_stack_ffffffffffffffa0;
  iterator local_58;
  RepeatedPtrIterator<const_google::protobuf::MethodDescriptorProto> local_50;
  RepeatedPtrField<google::protobuf::MethodDescriptorProto> *local_48;
  uint local_3c;
  size_t local_38;
  size_t local_28;
  InternalMetadataWithArena *local_20;
  undefined4 local_14;
  HasBits<1UL> *local_10;
  InternalMetadataWithArena *local_8;
  
  local_38 = 0;
  local_3c = 0;
  iVar2 = _internal_method_size((ServiceDescriptorProto *)0x5203a9);
  local_38 = (long)iVar2 + local_38;
  local_48 = &in_RDI->method_;
  local_50.it_ = (void **)RepeatedPtrField<google::protobuf::MethodDescriptorProto>::begin
                                    ((RepeatedPtrField<google::protobuf::MethodDescriptorProto> *)
                                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_58.it_ = (void **)RepeatedPtrField<google::protobuf::MethodDescriptorProto>::end
                                    ((RepeatedPtrField<google::protobuf::MethodDescriptorProto> *)
                                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while (bVar1 = internal::RepeatedPtrIterator<const_google::protobuf::MethodDescriptorProto>::
                 operator!=(&local_50,&local_58), bVar1) {
    in_stack_ffffffffffffffa0 =
         internal::RepeatedPtrIterator<const_google::protobuf::MethodDescriptorProto>::operator*
                   (&local_50);
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::MethodDescriptorProto>
                      ((MethodDescriptorProto *)0x520416);
    local_38 = sVar3 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::MethodDescriptorProto>::operator++
              (&local_50);
  }
  local_10 = &in_RDI->_has_bits_;
  local_14 = 0;
  local_3c = local_10->has_bits_[0];
  if ((local_3c & 3) != 0) {
    if ((local_3c & 1) != 0) {
      _internal_name_abi_cxx11_((ServiceDescriptorProto *)0x520475);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x52047d);
      local_38 = sVar3 + 1 + local_38;
    }
    if ((local_3c & 2) != 0) {
      sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::ServiceOptions>
                        ((ServiceOptions *)0x5204a5);
      local_38 = sVar3 + 1 + local_38;
    }
  }
  local_20 = &in_RDI->_internal_metadata_;
  local_8 = local_20;
  if (((uint)(local_20->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_28 = internal::ComputeUnknownFieldsSize
                         ((InternalMetadataWithArena *)in_stack_ffffffffffffffa0,
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          (CachedSize *)in_RDI);
  }
  else {
    internal::ToCachedSize(local_38);
    SetCachedSize(in_RDI,in_stack_ffffffffffffff8c);
    local_28 = local_38;
  }
  return local_28;
}

Assistant:

size_t ServiceDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.ServiceDescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  total_size += 1UL * this->_internal_method_size();
  for (const auto& msg : this->method_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional .google.protobuf.ServiceOptions options = 3;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}